

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void luaV_settable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  double dVar1;
  LuaType LVar2;
  Table *t_00;
  RaviArray *pRVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ushort uVar6;
  TValue *slot;
  ulong uVar7;
  char *pcVar8;
  Value VVar9;
  lua_Number value;
  double dVar10;
  undefined1 auVar11 [16];
  
  LVar2 = t->tt_;
  if (LVar2 == 0x8005) {
    if (key->tt_ == 0x13) {
      t_00 = (Table *)(t->value_).gc;
      if (t_00->tt != '\x05') {
LAB_00128bf1:
        pcVar8 = "(((t)->value_).gc)->tt == 5";
        goto LAB_00128c0a;
      }
      uVar7 = (key->value_).i - 1;
      if (uVar7 < t_00->sizearray) {
        slot = t_00->array + uVar7;
      }
      else {
        slot = luaH_getint(t_00,(key->value_).i);
      }
    }
    else {
      if (((Table *)(t->value_).gc)->tt != '\x05') goto LAB_00128bf1;
      slot = luaH_get((Table *)(t->value_).gc,key);
    }
    if (slot->tt_ == 0) {
LAB_00128a4b:
      luaV_finishset(L,t,key,val,slot);
      return;
    }
    slot->value_ = val->value_;
    uVar6 = val->tt_;
    slot->tt_ = uVar6;
    if (((short)uVar6 < 0) &&
       (((uVar6 & 0x7f) != (ushort)((slot->value_).gc)->tt ||
        ((L != (lua_State *)0x0 &&
         ((((slot->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
      pcVar8 = "0";
    }
    else {
      if (-1 < (short)val->tt_) {
        return;
      }
      if ((short)t->tt_ < 0) {
        if ((((t->value_).gc)->marked & 0x20) == 0) {
          return;
        }
        if ((((val->value_).gc)->marked & 0x18) == 0) {
          return;
        }
        luaC_barrierback_(L,(t->value_).gc);
        return;
      }
      pcVar8 = "(((t)->tt_) & (1 << 15))";
    }
LAB_00128c0a:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
  }
  if (LVar2 == 0x8025) {
    pRVar3 = (RaviArray *)(t->value_).gc;
    if ((pRVar3->tt == '\x15') || (pRVar3->tt == '%')) {
      if (key->tt_ != 0x13) {
LAB_00128c22:
        luaG_typeerror(L,key,"index");
      }
      if (val->tt_ == 0x13) {
        uVar7 = (key->value_).i & 0xffffffff;
        if (pRVar3->len <= (uint)(key->value_).b) {
          value = (lua_Number)(val->value_).i;
LAB_00128b53:
          raviH_set_float(L,pRVar3,uVar7,value);
          return;
        }
        pcVar8 = pRVar3->data;
        VVar9.n = (lua_Number)(val->value_).i;
LAB_00128b40:
        *(Value *)(pcVar8 + uVar7 * 8) = VVar9;
        return;
      }
      if (val->tt_ == 3) {
        uVar7 = (key->value_).i & 0xffffffff;
        if (pRVar3->len <= (uint)(key->value_).b) {
          value = (val->value_).n;
          goto LAB_00128b53;
        }
        pcVar8 = pRVar3->data;
        VVar9 = val->value_;
        goto LAB_00128b40;
      }
      pcVar8 = "value cannot be converted to number";
      goto LAB_00128c4d;
    }
LAB_00128c34:
    pcVar8 = 
    "((((t)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t)->value_).gc)->tt == ((5) | ((2) << 4)))"
    ;
    goto LAB_00128c0a;
  }
  if (LVar2 != 0x8015) {
    slot = (TValue *)0x0;
    goto LAB_00128a4b;
  }
  pRVar3 = (RaviArray *)(t->value_).gc;
  if ((pRVar3->tt != '\x15') && (pRVar3->tt != '%')) goto LAB_00128c34;
  if (key->tt_ != 0x13) goto LAB_00128c22;
  uVar6 = 1;
  if (val->tt_ == 3) {
    dVar1 = (val->value_).n;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar1;
    auVar11 = vroundsd_avx(auVar11,auVar11,9);
    dVar10 = auVar11._0_8_;
    if ((dVar10 != dVar1) || (NAN(dVar10) || NAN(dVar1))) goto LAB_00128b79;
    uVar4 = vcmppd_avx512vl(auVar11,ZEXT816(0x43e0000000000000),5);
    uVar5 = vcmppd_avx512vl(ZEXT816(0xc3e0000000000000),auVar11,6);
    uVar6 = (ushort)uVar5 & 3 | (ushort)uVar4 & 3;
    VVar9.gc = (GCObject *)0x0;
    if ((uVar6 & 1) == 0) {
      VVar9.i = (long)dVar10;
    }
  }
  else {
    if (val->tt_ == 0x13) {
      uVar7 = (key->value_).i & 0xffffffff;
      if (pRVar3->len <= (uint)(key->value_).b) {
        VVar9 = (Value)(val->value_).i;
        goto LAB_00128ba4;
      }
      pcVar8 = pRVar3->data;
      VVar9 = val->value_;
      goto LAB_00128b91;
    }
LAB_00128b79:
    VVar9.gc = (GCObject *)0x0;
  }
  if ((uVar6 & 1) == 0) {
    uVar7 = (key->value_).i & 0xffffffff;
    if (pRVar3->len <= (uint)(key->value_).b) {
LAB_00128ba4:
      raviH_set_int(L,pRVar3,uVar7,VVar9.i);
      return;
    }
    pcVar8 = pRVar3->data;
LAB_00128b91:
    *(Value *)(pcVar8 + uVar7 * 8) = VVar9;
    return;
  }
  pcVar8 = "value cannot be converted to integer";
LAB_00128c4d:
  luaG_runerror(L,pcVar8);
}

Assistant:

void luaV_settable (lua_State *L, const TValue *t, TValue *key, StkId val) {
  SETTABLE_INLINE(L, t, key, val);
}